

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAML.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jaegertracing::utils::yaml::findOrDefault<std::__cxx11::string,char[19],char[1]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,yaml *this,Node *node,char (*key) [19],char (*defaultValue) [1])

{
  node *pnVar1;
  bool bVar2;
  allocator local_55 [13];
  undefined1 local_48 [8];
  Node valueNode;
  char (*defaultValue_local) [1];
  char (*key_local) [19];
  Node *node_local;
  
  valueNode.m_pNode = (node *)key;
  YAML::Node::operator[]<char[19]>((Node *)local_48,(Node *)this,&node->m_isValid);
  bVar2 = YAML::Node::IsDefined((Node *)local_48);
  pnVar1 = valueNode.m_pNode;
  if (bVar2) {
    YAML::Node::as<std::__cxx11::string>(__return_storage_ptr__,(Node *)local_48);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)pnVar1,local_55);
    std::allocator<char>::~allocator((allocator<char> *)local_55);
  }
  YAML::Node::~Node((Node *)local_48);
  return __return_storage_ptr__;
}

Assistant:

ValueType findOrDefault(const YAML::Node& node,
                        const KeyType& key,
                        const DefaultValueType& defaultValue)
{
    const auto valueNode = node[key];
    if (!valueNode.IsDefined()) {
        return defaultValue;
    }
    return valueNode.template as<ValueType>();
}